

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  ExprList *pEVar1;
  Expr *pExpr;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  CollSeq *pCVar7;
  int m;
  int n;
  char *zType;
  ExprList_item *a;
  Expr *p;
  int i;
  CollSeq *pColl;
  Column *pCol;
  NameContext sNC;
  sqlite3 *db;
  Select *pSelect_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  sNC.pWinSelect = (Select *)pParse->db;
  if (((sqlite3 *)sNC.pWinSelect)->mallocFailed == '\0') {
    memset(&pCol,0,0x38);
    sNC.pParse = (Parse *)pSelect->pSrc;
    pEVar1 = pSelect->pEList;
    p._4_4_ = 0;
    pColl = (CollSeq *)pTab->aCol;
    for (; p._4_4_ < pTab->nCol; p._4_4_ = p._4_4_ + 1) {
      pExpr = pEVar1->a[p._4_4_].pExpr;
      pcVar5 = columnTypeImpl((NameContext *)&pCol,pExpr);
      cVar2 = sqlite3ExprAffinity(pExpr);
      *(char *)((long)&pColl->xCmp + 1) = cVar2;
      if (pcVar5 != (char *)0x0) {
        iVar3 = sqlite3Strlen30(pcVar5);
        iVar4 = sqlite3Strlen30(pColl->zName);
        pcVar6 = (char *)sqlite3DbReallocOrFree
                                   ((sqlite3 *)sNC.pWinSelect,pColl->zName,(long)(iVar4 + iVar3 + 2)
                                   );
        pColl->zName = pcVar6;
        if (pColl->zName != (char *)0x0) {
          memcpy(pColl->zName + (iVar4 + 1),pcVar5,(long)(iVar3 + 1));
          *(byte *)((long)&pColl->xCmp + 3) = *(byte *)((long)&pColl->xCmp + 3) | 4;
        }
      }
      if (*(char *)((long)&pColl->xCmp + 1) == '\0') {
        *(undefined1 *)((long)&pColl->xCmp + 1) = 0x41;
      }
      pCVar7 = sqlite3ExprCollSeq(pParse,pExpr);
      if ((pCVar7 != (CollSeq *)0x0) && (pColl->pUser == (void *)0x0)) {
        pcVar5 = sqlite3DbStrDup((sqlite3 *)sNC.pWinSelect,pCVar7->zName);
        pColl->pUser = pcVar5;
      }
      pColl = (CollSeq *)&pColl->xDel;
    }
    pTab->szTabRow = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0);
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType ){
      m = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}